

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O1

vec2 djb::ggx::u2_to_md2(vec2 *u,float_t zi)

{
  vec2 vVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float local_20;
  
  fVar4 = 1.0 / (zi + 1.0);
  fVar2 = u->x;
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  fVar3 = u->y;
  if (fVar3 <= fVar4) {
    local_20 = (fVar3 / fVar4) * 3.1415927;
    fVar4 = sinf(local_20);
    fVar4 = -fVar4;
  }
  else {
    local_20 = ((fVar3 - fVar4) / (1.0 - fVar4)) * 3.1415927 + 3.1415927;
    fVar4 = sinf(local_20);
    fVar4 = -fVar4 * zi;
  }
  fVar3 = cosf(local_20);
  vVar1.y = fVar3 * fVar2;
  vVar1.x = fVar4 * fVar2;
  return vVar1;
}

Assistant:

vec2 ggx::u2_to_md2(const vec2& u, float_t zi)
{
	float_t a = 1 / (1 + zi);

#if 0
	if (u.x > a) {
		float_t xu = (u.x - a) / (1 - a); // remap to [0, 1]

		return vec2(zi, 1) * u2_to_hd2(vec2(xu, u.y));
	} else {
		float_t xu = (u.x - a) / a; // remap to [-1, 0]

		return u2_to_hd2(vec2(xu, u.y));
	}
#else
	float_t nrm = sqrt(u.x);

	if (u.y > a) {
		float_t uy = (u.y - a) / (1 - a); // remap to [0, 1]
		float_t phi = uy * m_pi() + m_pi();

		return nrm * vec2(-sin(phi) * zi, cos(phi));
	} else {
		float_t uy = u.y / a; // remap to [0, 1]
		float_t phi = uy * m_pi();

		return nrm * vec2(-sin(phi), cos(phi));
	}
#endif
}